

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O1

void bssl::VerifyCertErrors
               (string *expected_errors_str,CertErrors *actual_errors,string *errors_file_path)

{
  size_t __n;
  int iVar1;
  pointer *__ptr;
  string actual_errors_str;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  string local_38;
  
  CertErrors::ToDebugString_abi_cxx11_(&local_38,actual_errors);
  __n = expected_errors_str->_M_string_length;
  if (__n == local_38._M_string_length) {
    if (__n == 0) goto LAB_003bc4a0;
    iVar1 = bcmp((expected_errors_str->_M_dataplus)._M_p,local_38._M_dataplus._M_p,__n);
    if (iVar1 == 0) goto LAB_003bc4a0;
  }
  testing::Message::Message((Message *)&local_48);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),"Cert errors don\'t match expectations (",
             0x26);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),(errors_file_path->_M_dataplus)._M_p,
             errors_file_path->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),")\n\n",3);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),"EXPECTED:\n\n",0xb);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),(expected_errors_str->_M_dataplus)._M_p,
             expected_errors_str->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),"ACTUAL:\n\n",9);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),local_38._M_dataplus._M_p,
             local_38._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),
             "===> Use pki/testdata/parse_certificate_unittest/rebase-errors.py to rebaseline.\n",
             0x51);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/test_helpers.cc"
             ,0x1d6,"Failed");
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
LAB_003bc4a0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VerifyCertErrors(const std::string &expected_errors_str,
                      const CertErrors &actual_errors,
                      const std::string &errors_file_path) {
  std::string actual_errors_str = actual_errors.ToDebugString();

  if (expected_errors_str != actual_errors_str) {
    ADD_FAILURE() << "Cert errors don't match expectations ("
                  << errors_file_path << ")\n\n"
                  << "EXPECTED:\n\n"
                  << expected_errors_str << "\n"
                  << "ACTUAL:\n\n"
                  << actual_errors_str << "\n"
                  << "===> Use "
                     "pki/testdata/parse_certificate_unittest/"
                     "rebase-errors.py to rebaseline.\n";
  }
}